

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopGetIthCareLit(char *pSop,int i)

{
  int iVar1;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  while( true ) {
    if (*pSop == '\0') {
      return -1;
    }
    if (pSop[i] != 0x2d) break;
    pSop = pSop + (iVar1 + 3);
  }
  return pSop[i] + -0x30;
}

Assistant:

int Abc_SopGetIthCareLit( char * pSop, int i )
{
    char * pCube;
    int nVars;
    nVars = Abc_SopGetVarNum( pSop );
    Abc_SopForEachCube( pSop, nVars, pCube )
        if ( pCube[i] != '-' )
            return pCube[i] - '0';
    return -1;
}